

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_affine.cpp
# Opt level: O2

void __thiscall agg::trans_affine::scaling(trans_affine *this,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  trans_affine t;
  trans_affine local_78;
  trans_affine local_48;
  
  local_78.sx = this->sx;
  local_78.shy = this->shy;
  local_78.shx = this->shx;
  local_78.sy = this->sy;
  local_78.tx = this->tx;
  local_78.ty = this->ty;
  dVar1 = rotation(this);
  dVar2 = cos(-dVar1);
  dVar3 = sin(-dVar1);
  dVar4 = sin(-dVar1);
  local_48.sy = cos(-dVar1);
  local_48.shx = -dVar4;
  local_48.tx = 0.0;
  local_48.ty = 0.0;
  local_48.sx = dVar2;
  local_48.shy = dVar3;
  multiply(&local_78,&local_48);
  *x = (local_78.sx + local_78.shx + local_78.tx) -
       (local_78.sx * 0.0 + local_78.shx * 0.0 + local_78.tx);
  *y = (local_78.shy + local_78.sy + local_78.ty) -
       (local_78.shy * 0.0 + local_78.sy * 0.0 + local_78.ty);
  return;
}

Assistant:

void trans_affine::scaling(double* x, double* y) const
    {
        double x1 = 0.0;
        double y1 = 0.0;
        double x2 = 1.0;
        double y2 = 1.0;
        trans_affine t(*this);
        t *= trans_affine_rotation(-rotation());
        t.transform(&x1, &y1);
        t.transform(&x2, &y2);
        *x = x2 - x1;
        *y = y2 - y1;
    }